

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInput.cpp
# Opt level: O3

uint32_t gr::swapb(uint32_t nArg)

{
  return nArg >> 0x18 | (nArg & 0xff0000) >> 8 | (nArg & 0xff00) << 8 | nArg << 0x18;
}

Assistant:

uint32_t swapb(uint32_t nArg)
{
#if WORDS_BIGENDIAN
return nArg;
#else
	int b1, b2, b3, b4;
	b1 = ((nArg & 0xFF000000) >> 24)     & 0x000000FF;	// remove sign extension
	b2 = ((nArg & 0x00FF0000) >> 8);  // & 0x0000FF00;
	b3 = ((nArg & 0x0000FF00) << 8);  // & 0x00FF0000;
	b4 = ((nArg & 0x000000FF) << 24); // & 0xFF000000;
	int nRet = b1 | b2 | b3 | b4;
	return nRet;
#endif
}